

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square_tm.hpp
# Opt level: O2

exp_number __thiscall
ising::free_energy::square::transfer_matrix<double>::product_U
          (transfer_matrix<double> *this,uint_t Ly,real_t_conflict Jx,real_t_conflict beta,
          exp_number *factor,vector<double,_std::allocator<double>_> *v,
          vector<double,_std::allocator<double>_> *v_10,
          vector<double,_std::allocator<double>_> *v_20,
          vector<double,_std::allocator<double>_> *v_01,
          vector<double,_std::allocator<double>_> *v_02,vector<double,_std::allocator<double>_> *vt)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  uint_t s;
  uint_t uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  exp_number<double> eVar13;
  exp_number eVar14;
  
  uVar10 = (ulong)(1 << ((byte)Ly & 0x1f));
  dVar11 = exp(Jx * beta);
  dVar12 = exp(-beta * Jx);
  for (uVar6 = 0; uVar6 != Ly; uVar6 = uVar6 + 1) {
    uVar9 = (ulong)(1 << ((byte)uVar6 & 0x1f));
    pdVar1 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (v_10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (v_20->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (vt->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar7 = 0; uVar10 != uVar7; uVar7 = uVar7 + 1) {
      uVar8 = uVar7 ^ uVar9;
      pdVar4[uVar7] =
           pdVar3[uVar7] * dVar11 + pdVar3[uVar8] * dVar12 +
           (pdVar1[uVar7] * dVar11 + pdVar1[uVar8] * dVar12) * Jx * Jx +
           (pdVar2[uVar7] * dVar11 + pdVar2[uVar8] * -dVar12) * (Jx + Jx);
    }
    std::_Vector_base<double,_std::allocator<double>_>::_Vector_impl_data::_M_swap_data
              ((_Vector_impl_data *)v_20,(_Vector_impl_data *)vt);
    pdVar1 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (v_10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (vt->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar7 = 0; uVar10 != uVar7; uVar7 = uVar7 + 1) {
      pdVar3[uVar7] =
           (pdVar1[uVar7] * dVar11 + pdVar1[uVar7 ^ uVar9] * -dVar12) * Jx +
           pdVar2[uVar7] * dVar11 + pdVar2[uVar7 ^ uVar9] * dVar12;
    }
    std::_Vector_base<double,_std::allocator<double>_>::_Vector_impl_data::_M_swap_data
              ((_Vector_impl_data *)v_10,(_Vector_impl_data *)vt);
    pdVar1 = (v_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (vt->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar7 = 0; uVar10 != uVar7; uVar7 = uVar7 + 1) {
      pdVar2[uVar7] = pdVar1[uVar7] * dVar11 + pdVar1[uVar7 ^ uVar9] * dVar12;
    }
    std::_Vector_base<double,_std::allocator<double>_>::_Vector_impl_data::_M_swap_data
              ((_Vector_impl_data *)v_02,(_Vector_impl_data *)vt);
    pdVar1 = (v_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (vt->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar7 = 0; uVar10 != uVar7; uVar7 = uVar7 + 1) {
      pdVar2[uVar7] = pdVar1[uVar7] * dVar11 + pdVar1[uVar7 ^ uVar9] * dVar12;
    }
    std::_Vector_base<double,_std::allocator<double>_>::_Vector_impl_data::_M_swap_data
              ((_Vector_impl_data *)v_01,(_Vector_impl_data *)vt);
    pdVar1 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (vt->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar7 = 0; uVar10 != uVar7; uVar7 = uVar7 + 1) {
      pdVar2[uVar7] = pdVar1[uVar7] * dVar11 + pdVar1[uVar7 ^ uVar9] * dVar12;
    }
    std::_Vector_base<double,_std::allocator<double>_>::_Vector_impl_data::_M_swap_data
              ((_Vector_impl_data *)v,(_Vector_impl_data *)vt);
  }
  dVar11 = 0.0;
  for (uVar7 = 0; uVar10 != uVar7; uVar7 = uVar7 + 1) {
    dVar12 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar7];
    dVar11 = dVar11 + dVar12 * dVar12;
  }
  if (dVar11 < 0.0) {
    dVar11 = sqrt(dVar11);
  }
  else {
    dVar11 = SQRT(dVar11);
  }
  dVar11 = 1.0 / dVar11;
  pdVar1 = (v_20->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (v_10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (v_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (v_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  for (uVar7 = 0; uVar10 != uVar7; uVar7 = uVar7 + 1) {
    pdVar1[uVar7] = pdVar1[uVar7] * dVar11;
    pdVar2[uVar7] = pdVar2[uVar7] * dVar11;
    pdVar3[uVar7] = pdVar3[uVar7] * dVar11;
    pdVar4[uVar7] = pdVar4[uVar7] * dVar11;
    pdVar5[uVar7] = pdVar5[uVar7] * dVar11;
  }
  eVar13 = standards::operator/((standards *)this,factor,dVar11);
  eVar14.log_ = eVar13.log_;
  eVar14._8_8_ = this;
  return eVar14;
}

Assistant:

static exp_number product_U(uint_t Ly, real_t Jx, real_t beta,
                              exp_number factor, std::vector<real_t> &v,
                              std::vector<real_t> &v_10,
                              std::vector<real_t> &v_20,
                              std::vector<real_t> &v_01,
                              std::vector<real_t> &v_02,
                              std::vector<real_t> &vt) {
    uint_t dim = 1 << Ly;
    boost::array<double, 2> weight;
    weight[0] = std::exp(beta * Jx);
    weight[1] = std::exp(-beta * Jx);
    for (uint_t s = 0; s < Ly; ++s) {
      for (uint_t c0 = 0; c0 < dim; ++c0) {
        uint_t c1 = c0 ^ (1 << s);
        vt[c0] = Jx * Jx * (weight[0] * v[c0] + weight[1] * v[c1]) +
                 2 * Jx * (weight[0] * v_10[c0] - weight[1] * v_10[c1]) +
                 (weight[0] * v_20[c0] + weight[1] * v_20[c1]);
      }
      std::swap(v_20, vt);
      for (uint_t c0 = 0; c0 < dim; ++c0) {
        uint_t c1 = c0 ^ (1 << s);
        vt[c0] = Jx * (weight[0] * v[c0] - weight[1] * v[c1]) +
                 (weight[0] * v_10[c0] + weight[1] * v_10[c1]);
      }
      std::swap(v_10, vt);
      for (uint_t c0 = 0; c0 < dim; ++c0) {
        uint_t c1 = c0 ^ (1 << s);
        vt[c0] = (weight[0] * v_02[c0] + weight[1] * v_02[c1]);
      }
      std::swap(v_02, vt);
      for (uint_t c0 = 0; c0 < dim; ++c0) {
        uint_t c1 = c0 ^ (1 << s);
        vt[c0] = (weight[0] * v_01[c0] + weight[1] * v_01[c1]);
      }
      std::swap(v_01, vt);
      for (uint_t c0 = 0; c0 < dim; ++c0) {
        uint_t c1 = c0 ^ (1 << s);
        vt[c0] = weight[0] * v[c0] + weight[1] * v[c1];
      }
      std::swap(v, vt);
    }
    real_t norm2 = 0;
    for (uint_t c = 0; c < dim; ++c) {
      norm2 += v[c] * v[c];
    }
    real_t norm_inv = 1 / std::sqrt(norm2);
    for (uint_t c = 0; c < dim; ++c) {
      v_20[c] *= norm_inv;
      v_10[c] *= norm_inv;
      v_02[c] *= norm_inv;
      v_01[c] *= norm_inv;
      v[c] *= norm_inv;
    }
    return factor / norm_inv;
  }